

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void VP8SetSegmentParams(VP8Encoder *enc,float quality)

{
  int iVar1;
  int iVar2;
  long *in_RDI;
  float in_XMM0_Da;
  VP8Encoder *enc_00;
  double dVar3;
  int q;
  double c;
  double expn;
  double c_base;
  double Q;
  double amp;
  int num_segments;
  int dq_uv_dc;
  int dq_uv_ac;
  int i;
  double local_58;
  double in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  iVar4 = (int)in_RDI[4];
  iVar2 = *(int *)(*in_RDI + 0x1c);
  enc_00 = (VP8Encoder *)((double)in_XMM0_Da / 100.0);
  if (*(int *)(*in_RDI + 0x50) == 0) {
    local_58 = QualityToCompression(in_stack_ffffffffffffffc0);
  }
  else {
    local_58 = QualityToJPEGCompression
                         ((double)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
                          (double)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
    dVar3 = pow(local_58,-((((double)iVar2 * 0.9) / 100.0) / 128.0) *
                         (double)(int)in_RDI[(long)iVar5 * 0x5d + 0xa0] + 1.0);
    iVar1 = clip((int)((1.0 - dVar3) * 127.0),0,0x7f);
    *(int *)(in_RDI + (long)iVar5 * 0x5d + 0xa1) = iVar1;
  }
  *(int *)(in_RDI + 0x1c0) = (int)in_RDI[0xa1];
  for (iVar2 = iVar4; iVar2 < 4; iVar2 = iVar2 + 1) {
    *(int *)(in_RDI + (long)iVar2 * 0x5d + 0xa1) = (int)in_RDI[0x1c0];
  }
  iVar2 = clip((((((int)in_RDI[0x1c1] + -0x40) * 10) / 0x46) * *(int *)(*in_RDI + 0x1c)) / 100,-4,6)
  ;
  iVar5 = clip((*(int *)(*in_RDI + 0x1c) * -4) / 100,-0xf,0xf);
  *(undefined4 *)((long)in_RDI + 0xe0c) = 0;
  *(undefined4 *)(in_RDI + 0x1c2) = 0;
  *(undefined4 *)((long)in_RDI + 0xe14) = 0;
  *(int *)(in_RDI + 0x1c3) = iVar5;
  *(int *)((long)in_RDI + 0xe1c) = iVar2;
  SetupFilterStrength(enc_00);
  if (1 < iVar4) {
    SimplifySegments((VP8Encoder *)CONCAT44(iVar4,in_stack_ffffffffffffffe0));
  }
  SetupMatrices(enc_00);
  return;
}

Assistant:

void VP8SetSegmentParams(VP8Encoder* const enc, float quality) {
  int i;
  int dq_uv_ac, dq_uv_dc;
  const int num_segments = enc->segment_hdr.num_segments;
  const double amp = SNS_TO_DQ * enc->config->sns_strength / 100. / 128.;
  const double Q = quality / 100.;
  const double c_base = enc->config->emulate_jpeg_size ?
      QualityToJPEGCompression(Q, enc->alpha / 255.) :
      QualityToCompression(Q);
  for (i = 0; i < num_segments; ++i) {
    // We modulate the base coefficient to accommodate for the quantization
    // susceptibility and allow denser segments to be quantized more.
    const double expn = 1. - amp * enc->dqm[i].alpha;
    const double c = pow(c_base, expn);
    const int q = (int)(127. * (1. - c));
    assert(expn > 0.);
    enc->dqm[i].quant = clip(q, 0, 127);
  }

  // purely indicative in the bitstream (except for the 1-segment case)
  enc->base_quant = enc->dqm[0].quant;

  // fill-in values for the unused segments (required by the syntax)
  for (i = num_segments; i < NUM_MB_SEGMENTS; ++i) {
    enc->dqm[i].quant = enc->base_quant;
  }

  // uv_alpha is normally spread around ~60. The useful range is
  // typically ~30 (quite bad) to ~100 (ok to decimate UV more).
  // We map it to the safe maximal range of MAX/MIN_DQ_UV for dq_uv.
  dq_uv_ac = (enc->uv_alpha - MID_ALPHA) * (MAX_DQ_UV - MIN_DQ_UV)
                                         / (MAX_ALPHA - MIN_ALPHA);
  // we rescale by the user-defined strength of adaptation
  dq_uv_ac = dq_uv_ac * enc->config->sns_strength / 100;
  // and make it safe.
  dq_uv_ac = clip(dq_uv_ac, MIN_DQ_UV, MAX_DQ_UV);
  // We also boost the dc-uv-quant a little, based on sns-strength, since
  // U/V channels are quite more reactive to high quants (flat DC-blocks
  // tend to appear, and are unpleasant).
  dq_uv_dc = -4 * enc->config->sns_strength / 100;
  dq_uv_dc = clip(dq_uv_dc, -15, 15);   // 4bit-signed max allowed

  enc->dq_y1_dc = 0;       // TODO(skal): dq-lum
  enc->dq_y2_dc = 0;
  enc->dq_y2_ac = 0;
  enc->dq_uv_dc = dq_uv_dc;
  enc->dq_uv_ac = dq_uv_ac;

  SetupFilterStrength(enc);   // initialize segments' filtering, eventually

  if (num_segments > 1) SimplifySegments(enc);

  SetupMatrices(enc);         // finalize quantization matrices
}